

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_scan_message(char *src,char *address,size_t adrsize,rtosc_arg_val_t *args,size_t n,
                         char *buffer_for_strings,size_t bufsize)

{
  int iVar1;
  ushort **ppuVar2;
  char *buffer_for_strings_00;
  size_t sVar3;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar4;
  size_t unaff_retaddr;
  rtosc_arg_val_t *in_stack_00000008;
  size_t rd;
  char *in_stack_ffffffffffffffb8;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar5;
  ulong local_38;
  char *bufsize_00;
  
  local_38 = 0;
  while( true ) {
    bVar4 = false;
    if (*in_RDI != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)*in_RDI] & 0x2000) != 0;
    }
    if (!bVar4) break;
    local_38 = local_38 + 1;
    in_RDI = in_RDI + 1;
  }
  uVar5 = 0;
  while (*in_RDI == '%') {
    iVar1 = skip_fmt((char **)CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffc6,
                                                      CONCAT15(in_stack_ffffffffffffffc5,
                                                               in_stack_ffffffffffffffc0))),
                     in_stack_ffffffffffffffb8);
    local_38 = (long)iVar1 + local_38;
  }
  while( true ) {
    bVar4 = false;
    bufsize_00 = in_RSI;
    buffer_for_strings_00 = in_RDI;
    if (*in_RDI != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar4 = false;
      bufsize_00 = in_RSI;
      buffer_for_strings_00 = in_RDI;
      if (((*ppuVar2)[(int)*in_RDI] & 0x2000) == 0) {
        bVar4 = local_38 < in_RDX;
      }
    }
    if (!bVar4) break;
    in_RDI = buffer_for_strings_00 + 1;
    in_RSI = bufsize_00 + 1;
    *bufsize_00 = *buffer_for_strings_00;
    local_38 = local_38 + 1;
  }
  *bufsize_00 = '\0';
  while( true ) {
    bVar4 = false;
    if (*buffer_for_strings_00 != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar4 = ((*ppuVar2)[(int)*buffer_for_strings_00] & 0x2000) != 0;
    }
    if (!bVar4) break;
    local_38 = local_38 + 1;
    buffer_for_strings_00 = buffer_for_strings_00 + 1;
  }
  sVar3 = rtosc_scan_arg_vals((char *)rd,in_stack_00000008,unaff_retaddr,buffer_for_strings_00,
                              (size_t)bufsize_00);
  return sVar3 + local_38;
}

Assistant:

size_t rtosc_scan_message(const char* src,
                          char* address, size_t adrsize,
                          rtosc_arg_val_t *args, size_t n,
                          char* buffer_for_strings, size_t bufsize)
{
    size_t rd = 0;
    for(;*src && isspace(*src); ++src) ++rd;
    while (*src == '%')
        rd += skip_fmt(&src, "%*[^\n] %n");

    assert(*src == '/');
    for(; *src && !isspace(*src) && rd < adrsize; ++rd)
        *address++ = *src++;
    assert(rd < adrsize); // otherwise, the address was too long
    *address = 0;

    for(;*src && isspace(*src); ++src) ++rd;

    rd += rtosc_scan_arg_vals(src, args, n, buffer_for_strings, bufsize);

    return rd;
}